

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_contexts.hpp
# Opt level: O1

vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_> * __thiscall
timing_registry::collectChildren
          (vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>
           *__return_storage_ptr__,timing_registry *this,
          vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> *children,
          double *totalDuration)

{
  task_handle *ptVar1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  task_info *in_RAX;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  ulong uVar7;
  __node_base_ptr p_Var8;
  task_handle *c;
  task_handle *this_00;
  task_info *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = in_RAX;
  std::vector<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>::reserve
            (__return_storage_ptr__,
             (long)(children->
                   super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(children->
                   super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 4);
  *totalDuration = 0.0;
  this_00 = (children->super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ptVar1 = (children->super__Vector_base<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (this_00 == ptVar1) {
      return __return_storage_ptr__;
    }
    oqpi::task_handle::validate(this_00);
    p_Var6 = (_Hash_node_base *)
             ((this_00->spTask_).super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->uid_;
    uVar2 = (this->tasks)._M_h._M_bucket_count;
    uVar7 = (ulong)p_Var6 % uVar2;
    p_Var3 = (this->tasks)._M_h._M_buckets[uVar7];
    p_Var5 = (__node_base_ptr)0x0;
    if ((p_Var3 != (__node_base_ptr)0x0) &&
       (p_Var5 = p_Var3, p_Var8 = p_Var3->_M_nxt, p_Var6 != p_Var3->_M_nxt[1]._M_nxt)) {
      while (p_Var4 = p_Var8->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var5 = (__node_base_ptr)0x0;
        if (((ulong)p_Var4[1]._M_nxt % uVar2 != uVar7) ||
           (p_Var5 = p_Var8, p_Var8 = p_Var4, p_Var6 == p_Var4[1]._M_nxt)) goto LAB_00177ea0;
      }
      p_Var5 = (__node_base_ptr)0x0;
    }
LAB_00177ea0:
    if (p_Var5 == (__node_base_ptr)0x0) {
      p_Var6 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var6 = p_Var5->_M_nxt;
    }
    local_38 = (task_info *)(p_Var6 + 2);
    std::vector<timing_registry::task_info*,std::allocator<timing_registry::task_info*>>::
    emplace_back<timing_registry::task_info*>
              ((vector<timing_registry::task_info*,std::allocator<timing_registry::task_info*>> *)
               __return_storage_ptr__,&local_38);
    *totalDuration =
         (__return_storage_ptr__->
         super__Vector_base<timing_registry::task_info_*,_std::allocator<timing_registry::task_info_*>_>
         )._M_impl.super__Vector_impl_data._M_finish[-1]->duration_ + *totalDuration;
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

std::vector<task_info*> collectChildren(const std::vector<oqpi::task_handle> &children, double &totalDuration)
    {
        std::vector<task_info*> infos;
        infos.reserve(children.size());
        totalDuration = 0;
        for (auto &c : children)
        {
            infos.push_back(&tasks.find(c.getUID())->second);
            totalDuration += infos.back()->duration_;
        }
        return infos;
    }